

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  path *ppVar2;
  iterator __first;
  iterator __last;
  reference __p;
  basic_ostream<char,_std::char_traits<char>_> *this;
  reference __s;
  iterator iVar3;
  iterator iVar4;
  size_type sVar5;
  iterator __first2;
  ostream *poVar6;
  reference pvVar7;
  ulong uVar8;
  char *__command;
  double dVar9;
  double dVar10;
  double dVar11;
  rep_conflict rVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int local_6e4;
  undefined1 local_6e0 [4];
  int i_2;
  ostream local_6c0 [8];
  ofstream output_file;
  undefined1 local_4c0 [8];
  string mkdir_command;
  undefined1 local_498 [8];
  string output_dir;
  value_type vStack_470;
  int i_1;
  double second;
  double first;
  int local_458;
  int dist;
  int i;
  bool any_greater_than_50;
  duration<double,_std::ratio<1L,_1000L>_> local_448;
  duration<double,_std::ratio<1L,_1000L>_> ms;
  time_point t2;
  double median;
  int half_way;
  undefined1 local_418 [8];
  vector<double,_std::allocator<double>_> v2;
  time_point t1;
  double skew;
  anon_class_16_2_62d78d09 third_moment;
  double std;
  double var;
  double mean;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_368;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_350;
  undefined1 local_338 [8];
  vector<double,_std::allocator<double>_> v;
  ifstream f;
  path *d;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *__range1_1;
  string local_e8;
  directory_entry *local_c8;
  directory_entry *p;
  undefined1 local_b0 [8];
  recursive_directory_iterator __end1;
  undefined1 local_90 [8];
  recursive_directory_iterator __begin1;
  char *local_70;
  path local_68;
  recursive_directory_iterator local_40;
  recursive_directory_iterator *local_30;
  recursive_directory_iterator *__range1;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  
  data_files.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  ::std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *)
         &__range1);
  local_70 = getenv("HOME");
  ::std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_68,&local_70,auto_format);
  ::std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_40,&local_68);
  ::std::filesystem::__cxx11::path::~path(&local_68);
  local_30 = &local_40;
  ::std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount,local_30);
  ::std::filesystem::__cxx11::begin
            ((__cxx11 *)local_90,(recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&__end1._M_dirs._M_refcount);
  ::std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&p,local_30);
  ::std::filesystem::__cxx11::end((recursive_directory_iterator *)local_b0);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&p);
  while (bVar1 = ::std::filesystem::__cxx11::operator!=
                           ((recursive_directory_iterator *)local_90,
                            (recursive_directory_iterator *)local_b0), bVar1) {
    local_c8 = (directory_entry *)
               ::std::filesystem::__cxx11::recursive_directory_iterator::operator*
                         ((recursive_directory_iterator *)local_90);
    ppVar2 = ::std::filesystem::__cxx11::directory_entry::path(local_c8);
    ::std::filesystem::__cxx11::path::string(&local_e8,ppVar2);
    bVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&local_e8,"_rse_workshop.dat");
    ::std::__cxx11::string::~string((string *)&local_e8);
    if (bVar1) {
      ppVar2 = ::std::filesystem::__cxx11::directory_entry::path(local_c8);
      ::std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&__range1,ppVar2);
    }
    ::std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)local_90);
  }
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_b0);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)local_90);
  ::std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_40)
  ;
  __first = ::std::
            vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)&__range1);
  __last = ::std::
           vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
           end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                *)&__range1);
  ::std::
  sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>>
            ((__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
              )__first._M_current,
             (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
              )__last._M_current);
  __end1_1 = ::std::
             vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ::begin((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                      *)&__range1);
  d = (path *)::std::
              vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ::end((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)&__range1);
  while (bVar1 = __gnu_cxx::
                 operator==<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                           (&__end1_1,
                            (__normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
                             *)&d), ((bVar1 ^ 0xffU) & 1) != 0) {
    __p = __gnu_cxx::
          __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
          ::operator*(&__end1_1);
    this = ::std::filesystem::__cxx11::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&::std::cout,__p);
    ::std::ostream::operator<<((ostream *)this,::std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::filesystem::__cxx11::path_*,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
    ::operator++(&__end1_1);
  }
  __s = ::std::
        vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
        operator[]((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    *)&__range1,0);
  ::std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)
             &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__s,_S_in);
  ::std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_350,
             (istream_type *)
             &v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  ::std::istream_iterator<double,_char,_std::char_traits<char>,_long>::istream_iterator(&local_368);
  ::std::allocator<double>::allocator((allocator<double> *)((long)&mean + 7));
  ::std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)local_338,&local_350,&local_368,
             (allocator<double> *)((long)&mean + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&mean + 7));
  iVar3 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar4 = ::std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_338);
  dVar9 = ::std::
          reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar3._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     iVar4._M_current,0.0);
  sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_338);
  auVar13._8_4_ = (int)(sVar5 >> 0x20);
  auVar13._0_8_ = sVar5;
  auVar13._12_4_ = 0x45300000;
  dVar9 = dVar9 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
  iVar3 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar4 = ::std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_338);
  __first2 = ::std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_338);
  dVar10 = ::std::
           transform_reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                     ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      iVar3._M_current,
                      (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      iVar4._M_current,
                      (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      __first2._M_current,0.0);
  sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_338);
  auVar14._8_4_ = (int)(sVar5 >> 0x20);
  auVar14._0_8_ = sVar5;
  auVar14._12_4_ = 0x45300000;
  dVar10 = dVar10 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) - dVar9 * dVar9;
  dVar11 = sqrt(dVar10);
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"mean:   ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar9);
  ::std::operator<<(poVar6,'\n');
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"var:    ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar10);
  ::std::operator<<(poVar6,'\n');
  iVar3 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_338);
  iVar4 = ::std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_338);
  dVar9 = ::std::
          transform_reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>,main::__0>
                    (iVar3._M_current,iVar4._M_current);
  sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_338);
  auVar15._8_4_ = (int)(sVar5 >> 0x20);
  auVar15._0_8_ = sVar5;
  auVar15._12_4_ = 0x45300000;
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"skew:   ");
  poVar6 = (ostream *)
           ::std::ostream::operator<<
                     (poVar6,dVar9 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))
                     );
  ::std::operator<<(poVar6,'\n');
  v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)::std::chrono::_V2::system_clock::now();
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_418,
             (vector<double,_std::allocator<double>_> *)local_338);
  iVar3 = ::std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_418);
  iVar4 = ::std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_418);
  ::std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar3._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar4._M_current);
  sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_418);
  pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_418,(long)(int)(sVar5 >> 1));
  dVar9 = *pvVar7;
  ms.__r = (rep_conflict)::std::chrono::_V2::system_clock::now();
  _i = ::std::chrono::operator-
                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&ms,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  ::std::chrono::duration<double,std::ratio<1l,1000l>>::
  duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_448,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&i);
  poVar6 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,::std::fixed);
  poVar6 = ::std::operator<<(poVar6,"median took ");
  rVar12 = ::std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_448);
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,rVar12);
  ::std::operator<<(poVar6," ms\n");
  poVar6 = ::std::operator<<((ostream *)&::std::cout,"median: ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dVar9);
  ::std::operator<<(poVar6,'\n');
  dist._3_1_ = false;
  for (local_458 = 0;
      sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_338),
      (ulong)(long)local_458 < sVar5; local_458 = local_458 + 1) {
    pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_338,(long)local_458);
    if (50.0 < *pvVar7) {
      dist._3_1_ = true;
    }
  }
  poVar6 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,::std::boolalpha);
  poVar6 = ::std::operator<<(poVar6,"Any greater than 50? ");
  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,dist._3_1_);
  ::std::operator<<(poVar6,'\n');
  first._4_4_ = 0;
  output_dir.field_2._12_4_ = 0;
  do {
    uVar8 = (ulong)(int)output_dir.field_2._12_4_;
    sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_338);
    if (sVar5 - 1 <= uVar8) {
LAB_00103f6e:
      poVar6 = ::std::operator<<((ostream *)&::std::cout,"Position ");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,first._4_4_);
      poVar6 = ::std::operator<<(poVar6,", first ");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,second);
      poVar6 = ::std::operator<<(poVar6," second: ");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,vStack_470);
      ::std::operator<<(poVar6,'\n');
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_498,"./output",
                 (allocator<char> *)(mkdir_command.field_2._M_local_buf + 0xf));
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(mkdir_command.field_2._M_local_buf + 0xf));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4c0,"mkdir -p ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_498);
      __command = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_4c0);
      system(__command);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_498,"/results.dat");
      ::std::ofstream::ofstream(local_6c0,(string *)local_6e0,_S_out);
      ::std::__cxx11::string::~string((string *)local_6e0);
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_338,0);
      ::std::ostream::operator<<(local_6c0,*pvVar7);
      for (local_6e4 = 1;
          sVar5 = ::std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)local_338),
          (ulong)(long)local_6e4 < sVar5; local_6e4 = local_6e4 + 1) {
        poVar6 = ::std::operator<<(local_6c0,',');
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_338,(long)local_6e4);
        ::std::ostream::operator<<(poVar6,*pvVar7);
      }
      ::std::ofstream::close();
      ::std::ofstream::~ofstream(local_6c0);
      ::std::__cxx11::string::~string((string *)local_4c0);
      ::std::__cxx11::string::~string((string *)local_498);
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_418);
      ::std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_338);
      ::std::ifstream::~ifstream
                (&v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ::std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ::~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 *)&__range1);
      return data_files.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_338,
                        (long)(output_dir.field_2._12_4_ + 1));
    dVar9 = *pvVar7;
    pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_338,
                        (long)(int)output_dir.field_2._12_4_);
    if (dVar11 * 2.0 < ABS(dVar9 - *pvVar7)) {
      first._4_4_ = output_dir.field_2._12_4_;
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_338,
                          (long)(int)output_dir.field_2._12_4_);
      second = *pvVar7;
      pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_338,
                          (long)(output_dir.field_2._12_4_ + 1));
      vStack_470 = *pvVar7;
      goto LAB_00103f6e;
    }
    output_dir.field_2._12_4_ = output_dir.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(v.begin(), v.end(), 0.0) / v.size();
    const double var = std::transform_reduce(v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew = std::transform_reduce(v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    std::sort(v2.begin(), v2.end());
    int half_way = v2.size() / 2;
    const double median = v2[half_way];

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    std::cout << "Position " << dist << ", first " << first << " second: " << second << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}